

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void out_token(c2m_ctx_t c2m_ctx,token_t t)

{
  pre_ctx *ppVar1;
  size_t sVar2;
  pre_ctx_t pre_ctx;
  token_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  if ((ppVar1->no_out_p == 0) &&
     (sVar2 = VARR_macro_call_tlength(ppVar1->macro_call_stack), sVar2 == 0)) {
    flush_buffer(c2m_ctx);
    (*ppVar1->pre_out_token_func)(c2m_ctx,t);
    return;
  }
  VARR_token_tpush(ppVar1->output_buffer,t);
  return;
}

Assistant:

static void out_token (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (no_out_p || VARR_LENGTH (macro_call_t, macro_call_stack) != 0) {
    VARR_PUSH (token_t, output_buffer, t);
    return;
  }
  flush_buffer (c2m_ctx);
  pre_out_token_func (c2m_ctx, t);
}